

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall kj::ArrayBuilder<unsigned_char>::dispose(ArrayBuilder<unsigned_char> *this)

{
  uchar *firstElement;
  RemoveConst<unsigned_char> *pRVar1;
  uchar *puVar2;
  uchar *endCopy;
  uchar *posCopy;
  uchar *ptrCopy;
  ArrayBuilder<unsigned_char> *this_local;
  
  firstElement = this->ptr;
  pRVar1 = this->pos;
  puVar2 = this->endPtr;
  if (firstElement != (uchar *)0x0) {
    this->ptr = (uchar *)0x0;
    this->pos = (RemoveConst<unsigned_char> *)0x0;
    this->endPtr = (uchar *)0x0;
    ArrayDisposer::dispose<unsigned_char>
              (this->disposer,firstElement,(long)pRVar1 - (long)firstElement,
               (long)puVar2 - (long)firstElement);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }